

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O1

bool __thiscall Boolean::Decode(Boolean *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  size_t sVar2;
  out_of_range *this_00;
  undefined8 *puVar3;
  size_t local_38;
  size_t size;
  
  local_38 = 0;
  size = 0;
  if ((cbIn < 3) || (-1 < (char)*pIn && *pIn != '\x01')) {
    if ((cbIn != 2) || (pIn[1] != '\0')) {
      if (((cbIn < 2) || (*pIn != '\x05')) || (pIn[1] != '\0')) {
        sVar2 = 0;
        bVar1 = false;
      }
      else {
        bVar1 = true;
        sVar2 = 2;
      }
      goto LAB_00139f41;
    }
    local_38 = 2;
    sVar2 = 2;
  }
  else {
    bVar1 = DecodeSize(pIn + 1,cbIn - 1,&local_38,&size);
    if (!bVar1) {
LAB_00139eb3:
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Illegal size value");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    sVar2 = size + 1;
    if (cbIn < local_38 + sVar2) goto LAB_00139eb3;
  }
  if (sVar2 + local_38 != 3) {
    size = sVar2;
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = std::__throw_bad_cast;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  this->b = -(pIn[2] != '\0');
  bVar1 = true;
  sVar2 = 3;
LAB_00139f41:
  *cbUsed = sVar2;
  return bVar1;
}

Assistant:

bool Boolean::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
	size_t size = 0;
	size_t cbPrefix = 0;
	if (!CheckDecode(pIn, cbIn, DerType::Boolean, size, cbPrefix))
	{
		return DecodeNull(pIn, cbIn, cbUsed);
	}

	// Now check specifics for this type
	if (cbPrefix + size != 3)
		throw std::exception(); // Incorrect decode

	b = pIn[2] ? 0xff : 0;
	cbUsed = 3;
	return true;
}